

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::warn(QPDF *this,qpdf_error_code_e error_code,string *object,qpdf_offset_t offset,
          string *message)

{
  string local_d0;
  QPDFExc local_b0;
  string *local_30;
  string *message_local;
  qpdf_offset_t offset_local;
  string *object_local;
  QPDF *pQStack_10;
  qpdf_error_code_e error_code_local;
  QPDF *this_local;
  
  local_30 = message;
  message_local = (string *)offset;
  offset_local = (qpdf_offset_t)object;
  object_local._4_4_ = error_code;
  pQStack_10 = this;
  getFilename_abi_cxx11_(&local_d0,this);
  QPDFExc::QPDFExc(&local_b0,error_code,&local_d0,(string *)offset_local,
                   (qpdf_offset_t)message_local,local_30);
  warn(this,&local_b0);
  QPDFExc::~QPDFExc(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void
QPDF::warn(
    qpdf_error_code_e error_code,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message)
{
    warn(QPDFExc(error_code, getFilename(), object, offset, message));
}